

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISInputManager.cpp
# Opt level: O0

void __thiscall OIS::InputManager::destroyInputObject(InputManager *this,Object *obj)

{
  bool bVar1;
  pointer ppVar2;
  char *file;
  long in_RSI;
  iterator in_RDI;
  iterator i;
  map<OIS::Object_*,_OIS::FactoryCreator_*,_std::less<OIS::Object_*>,_std::allocator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>_>
  *in_stack_ffffffffffffffa8;
  map<OIS::Object_*,_OIS::FactoryCreator_*,_std::less<OIS::Object_*>,_std::allocator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>_>
  *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffc0;
  OIS_ERROR in_stack_ffffffffffffffcc;
  Exception *in_stack_ffffffffffffffd0;
  _Self local_20;
  _Self local_18;
  long local_10;
  
  if (in_RSI != 0) {
    local_10 = in_RSI;
    local_18._M_node =
         (_Base_ptr)
         std::
         map<OIS::Object_*,_OIS::FactoryCreator_*,_std::less<OIS::Object_*>,_std::allocator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>_>
         ::find(in_stack_ffffffffffffffa8,(key_type *)0x148338);
    local_20._M_node =
         (_Base_ptr)
         std::
         map<OIS::Object_*,_OIS::FactoryCreator_*,_std::less<OIS::Object_*>,_std::allocator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>_>
         ::end(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) {
      file = (char *)__cxa_allocate_exception(0x20);
      Exception::Exception
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                 (int)((ulong)in_RDI._M_node >> 0x20),file);
      __cxa_throw(file,&Exception::typeinfo,Exception::~Exception);
    }
    ppVar2 = std::_Rb_tree_iterator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>::
             operator->((_Rb_tree_iterator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_> *)
                        0x14836f);
    (*ppVar2->second->_vptr_FactoryCreator[7])(ppVar2->second,local_10);
    std::
    map<OIS::Object*,OIS::FactoryCreator*,std::less<OIS::Object*>,std::allocator<std::pair<OIS::Object*const,OIS::FactoryCreator*>>>
    ::erase_abi_cxx11_(in_stack_ffffffffffffffb0,in_RDI);
  }
  return;
}

Assistant:

void InputManager::destroyInputObject(Object* obj)
{
	if(obj == nullptr)
		return;

	FactoryCreatedObject::iterator i = mFactoryObjects.find(obj);
	if(i != mFactoryObjects.end())
	{
		i->second->destroyObject(obj);
		mFactoryObjects.erase(i);
	}
	else
	{
		OIS_EXCEPT(E_General, "Object creator not known.");
	}
}